

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.hpp
# Opt level: O0

streamsize __thiscall
stream::checksum_filter::
read<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>
          (checksum_filter *this,linked_streambuf<char,_std::char_traits<char>_> *src,char *dest,
          streamsize n)

{
  streamsize sVar1;
  type *in_RDI;
  streamsize nread;
  linked_streambuf<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  hasher *in_stack_ffffffffffffffc0;
  
  sVar1 = boost::iostreams::
          read<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>
                    (in_stack_ffffffffffffffb0,in_RDI,0x1aeb55);
  if (sVar1 < 1) {
    if (*(long *)(in_RDI + 0x70) != 0) {
      crypto::hasher::finalize(in_stack_ffffffffffffffc0);
      memcpy(*(void **)(in_RDI + 0x70),&stack0xffffffffffffffb4,0x24);
      in_RDI[0x70] = '\0';
      in_RDI[0x71] = '\0';
      in_RDI[0x72] = '\0';
      in_RDI[0x73] = '\0';
      in_RDI[0x74] = '\0';
      in_RDI[0x75] = '\0';
      in_RDI[0x76] = '\0';
      in_RDI[0x77] = '\0';
    }
  }
  else {
    crypto::hasher::update
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0
              );
  }
  return sVar1;
}

Assistant:

std::streamsize read(Source & src, char * dest, std::streamsize n) {
		
		std::streamsize nread = boost::iostreams::read(src, dest, n);
		
		if(nread > 0) {
			hasher.update(dest, size_t(nread));
		} else if(output) {
			*output = hasher.finalize();
			output = NULL;
		}
		
		return nread;
	}